

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O1

void __thiscall Tree::reverseQuickSort(Tree *this,int L,int R)

{
  int iVar1;
  int iVar2;
  pointer piVar3;
  pointer pvVar4;
  pointer prVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  int iVar9;
  int R_00;
  int iVar10;
  pointer *pprVar11;
  pointer *pprVar12;
  long lVar13;
  pointer *pprVar14;
  pointer *pprVar15;
  long lVar16;
  int __tmp;
  
  do {
    R_00 = R;
    iVar10 = L;
    if (L <= R) {
      piVar3 = (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      iVar1 = piVar3[(R + L) / 2];
      pvVar4 = (this->m_vectorArray).
               super__Vector_base<std::vector<record,_std::allocator<record>_>,_std::allocator<std::vector<record,_std::allocator<record>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar13 = (long)iVar10 + -1;
        pprVar12 = (pointer *)
                   ((long)&pvVar4[(long)iVar10 + -1].
                           super__Vector_base<record,_std::allocator<record>_>._M_impl.
                           super__Vector_impl_data + 0x10);
        iVar9 = iVar10;
        do {
          iVar10 = iVar9;
          pprVar11 = pprVar12;
          iVar2 = piVar3[lVar13 + 1];
          lVar13 = lVar13 + 1;
          pprVar12 = pprVar11 + 3;
          iVar9 = iVar10 + 1;
        } while (iVar1 < iVar2);
        lVar16 = (long)R_00 + 1;
        pprVar15 = (pointer *)
                   ((long)&pvVar4[(long)R_00 + 1].
                           super__Vector_base<record,_std::allocator<record>_>._M_impl.
                           super__Vector_impl_data + 0x10);
        iVar9 = R_00;
        do {
          R_00 = iVar9;
          pprVar14 = pprVar15;
          lVar8 = lVar16 + -1;
          lVar16 = lVar16 + -1;
          pprVar15 = pprVar14 + -3;
          iVar9 = R_00 + -1;
        } while (piVar3[lVar8] < iVar1);
        if (lVar13 <= lVar16) {
          piVar3[lVar13] = piVar3[lVar8];
          piVar3[lVar16] = iVar2;
          uVar6 = pprVar11[1];
          uVar7 = pprVar11[2];
          prVar5 = *pprVar12;
          pprVar11[1] = pprVar14[-5];
          pprVar11[2] = pprVar14[-4];
          *pprVar12 = *pprVar15;
          pprVar14[-5] = (pointer)uVar6;
          pprVar14[-4] = (pointer)uVar7;
          *pprVar15 = prVar5;
          R_00 = R_00 + -1;
          iVar10 = iVar10 + 1;
        }
      } while (iVar10 <= R_00);
    }
    if (L < R_00) {
      reverseQuickSort(this,L,R_00);
    }
    L = iVar10;
  } while (iVar10 < R);
  return;
}

Assistant:

void reverseQuickSort(int L, int R) {
        int i = L;
        int j = R;
        int temp = m_weightArray[(i + j) / 2];
        while (i <= j) {
            while (m_weightArray[i] > temp) {
                i++;
            }
            while (m_weightArray[j] < temp) {
                j--;
            }
            if (i <= j) {
                swap(m_weightArray[i], m_weightArray[j]);
                swap(m_vectorArray[i], m_vectorArray[j]);
                i++;
                j--;
            }
        }
        if (L < j) {
            reverseQuickSort(L, j);
        }
        if (i < R) {
            reverseQuickSort(i, R);
        }
    }